

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O1

void TMS320C64x_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  cs_detail *pcVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 uVar9;
  char *__s;
  char tmp [8];
  SStream ss;
  undefined2 local_22c;
  undefined1 local_22a;
  SStream local_224;
  
  if (mci->csh->detail != CS_OPT_OFF) {
    pcVar1 = mci->flat_insn->detail;
    uVar6 = (ulong)insn->detail->groups_count;
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        switch(insn->detail->groups[uVar7]) {
        case 0x80:
          uVar9 = 1;
          break;
        case 0x81:
          uVar9 = 2;
          break;
        case 0x82:
          uVar9 = 3;
          break;
        case 0x83:
          uVar9 = 4;
          break;
        case 0x84:
          uVar9 = 5;
          break;
        default:
          bVar2 = true;
          uVar9 = 0;
          goto LAB_002693fd;
        }
        bVar2 = false;
LAB_002693fd:
        if (!bVar2) goto LAB_00269415;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    uVar9 = 0;
LAB_00269415:
    *(undefined4 *)&(pcVar1->field_6).x86.operands[4].field_0x4 = uVar9;
    SStream_Init(&local_224);
    uVar3 = (pcVar1->field_6).tms320c64x.condition.reg;
    if (uVar3 == 0) {
      SStream_concat0(&local_224,"||||||");
    }
    else {
      uVar8 = 0x7c;
      if ((pcVar1->field_6).x86.operands[4].type == X86_OP_REG) {
        uVar8 = 0x21;
      }
      pcVar4 = cs_reg_name(ud,uVar3);
      SStream_concat(&local_224,"[%c%s]|",(ulong)uVar8,pcVar4);
    }
    pcVar4 = strchr(insn_asm,9);
    if (pcVar4 == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = pcVar4 + 1;
      *pcVar4 = '\0';
    }
    SStream_concat0(&local_224,insn_asm);
    if ((__s == (char *)0x0) ||
       ((pcVar4 = strchr(__s,0x5b), pcVar5 = pcVar4, pcVar4 == (char *)0x0 &&
        (pcVar4 = strchr(__s,0x28), pcVar5 = pcVar4, pcVar4 == (char *)0x0)))) {
      local_22c = (ushort)local_22c._1_1_ << 8;
    }
    else {
      for (; (__s < pcVar4 && (pcVar5 = pcVar4, 1 < (byte)(*pcVar4 + 0x9fU))); pcVar4 = pcVar4 + -1)
      {
        pcVar5 = __s;
      }
      if (pcVar5 == __s) {
        builtin_strncpy(insn_asm,"Invalid!",9);
        return;
      }
      if (*pcVar5 == 'a') {
        local_22a = 0;
        local_22c = 0x5431;
      }
      else {
        local_22a = 0;
        local_22c = 0x5432;
      }
    }
    uVar3 = *(int *)&(pcVar1->field_6).x86.operands[4].field_0x4 - 1;
    if (uVar3 < 4) {
      SStream_concat(&local_224,&DAT_00595964 + *(int *)(&DAT_00595964 + (ulong)uVar3 * 4),
                     &local_22c,(ulong)(pcVar1->field_6).x86.operands[4].field_1.reg);
    }
    if ((pcVar1->field_6).x86.operands[4].field_1.mem.base != X86_REG_INVALID) {
      SStream_concat0(&local_224,"X");
    }
    if (__s != (char *)0x0) {
      SStream_concat(&local_224,"\t%s",__s);
    }
    if ((pcVar1->field_6).x86.operands[4].field_1.mem.index != X86_REG_INVALID) {
      SStream_concat(&local_224,"\t||");
    }
    strcpy(insn_asm,local_224.buffer);
  }
  return;
}

Assistant:

void TMS320C64x_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	SStream ss;
	char *p, *p2, tmp[8];
	unsigned int unit = 0;
	int i;
	cs_tms320c64x *tms320c64x;

	if (mci->csh->detail) {
		tms320c64x = &mci->flat_insn->detail->tms320c64x;

		for (i = 0; i < insn->detail->groups_count; i++) {
			switch(insn->detail->groups[i]) {
				case TMS320C64X_GRP_FUNIT_D:
					unit = TMS320C64X_FUNIT_D;
					break;
				case TMS320C64X_GRP_FUNIT_L:
					unit = TMS320C64X_FUNIT_L;
					break;
				case TMS320C64X_GRP_FUNIT_M:
					unit = TMS320C64X_FUNIT_M;
					break;
				case TMS320C64X_GRP_FUNIT_S:
					unit = TMS320C64X_FUNIT_S;
					break;
				case TMS320C64X_GRP_FUNIT_NO:
					unit = TMS320C64X_FUNIT_NO;
					break;
			}
			if (unit != 0)
				break;
		}
		tms320c64x->funit.unit = unit;

		SStream_Init(&ss);
		if (tms320c64x->condition.reg != TMS320C64X_REG_INVALID)
			SStream_concat(&ss, "[%c%s]|", (tms320c64x->condition.zero == 1) ? '!' : '|', cs_reg_name(ud, tms320c64x->condition.reg));
		else
			SStream_concat0(&ss, "||||||");

		p = strchr(insn_asm, '\t');
		if (p != NULL)
			*p++ = '\0';

		SStream_concat0(&ss, insn_asm);
		if ((p != NULL) && (((p2 = strchr(p, '[')) != NULL) || ((p2 = strchr(p, '(')) != NULL))) {
			while ((p2 > p) && ((*p2 != 'a') && (*p2 != 'b')))
				p2--;
			if (p2 == p) {
				strcpy(insn_asm, "Invalid!");
				return;
			}
			if (*p2 == 'a')
				strcpy(tmp, "1T");
			else
				strcpy(tmp, "2T");
		} else {
			tmp[0] = '\0';
		}
		switch(tms320c64x->funit.unit) {
			case TMS320C64X_FUNIT_D:
				SStream_concat(&ss, ".D%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_L:
				SStream_concat(&ss, ".L%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_M:
				SStream_concat(&ss, ".M%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_S:
				SStream_concat(&ss, ".S%s%u", tmp, tms320c64x->funit.side);
				break;
		}
		if (tms320c64x->funit.crosspath > 0)
			SStream_concat0(&ss, "X");

		if (p != NULL)
			SStream_concat(&ss, "\t%s", p);

		if (tms320c64x->parallel != 0)
			SStream_concat(&ss, "\t||");

		/* insn_asm is a buffer from an SStream, so there should be enough space */
		strcpy(insn_asm, ss.buffer);
	}
}